

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  result_type rVar2;
  ostream *poVar3;
  uint local_2844;
  PatternGeneration local_2840 [4];
  uint i;
  PatternGeneration pattern_generation;
  uniform_int_distribution<int> local_2830;
  uniform_int_distribution<int> dist;
  mt19937 mt;
  random_device rd;
  path scripts_path;
  path textures_path;
  string scripts_dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [8];
  string textures_dir;
  string local_88 [8];
  string output_dir;
  string local_68 [8];
  string media_dir;
  string local_48 [8];
  string type;
  uint local_24;
  uint local_20;
  uint resolution;
  uint start;
  uint textures;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  resolution = 0;
  local_20 = 0;
  local_24 = 0;
  _start = argv;
  argv_local._0_4_ = argc;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  parseArgs((int)argv_local,_start,&resolution,&local_20,(string *)local_68,&local_24,
            (string *)local_48);
  std::operator+(local_b8,(char *)local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &textures_path.field_0x18,(char *)local_68);
  boost::filesystem::path::path((path *)&scripts_path.field_0x18,local_b8);
  bVar1 = boost::filesystem::create_directories((path *)&scripts_path.field_0x18);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Created ");
    poVar3 = std::operator<<(poVar3,(string *)local_b8);
    poVar3 = std::operator<<(poVar3," folder");
    std::operator<<(poVar3,"\n");
  }
  boost::filesystem::path::path
            ((path *)((long)&rd.field_0 + 0x1380),(string_type *)&textures_path.field_0x18);
  bVar1 = boost::filesystem::create_directories((path *)((long)&rd.field_0 + 0x1380));
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Created ");
    poVar3 = std::operator<<(poVar3,(string *)&textures_path.field_0x18);
    poVar3 = std::operator<<(poVar3," folder");
    std::operator<<(poVar3,"\n");
  }
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar2 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist,(ulong)rVar2);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_2830);
  PatternGeneration::PatternGeneration(local_2840);
  local_2844 = local_20;
  do {
    if (resolution <= local_2844) {
      argv_local._4_4_ = 0;
      PatternGeneration::~PatternGeneration(local_2840);
      std::random_device::~random_device((random_device *)&mt._M_p);
      boost::filesystem::path::~path((path *)((long)&rd.field_0 + 0x1380));
      boost::filesystem::path::~path((path *)&scripts_path.field_0x18);
      std::__cxx11::string::~string((string *)&textures_path.field_0x18);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
      return argv_local._4_4_;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"\rGenerating ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2844 + 1);
    poVar3 = std::operator<<(poVar3," of ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,resolution);
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"all");
    if (bVar1) {
      generateFlatTexture(local_2840,&local_24,&local_2844,local_b8,
                          (string *)&textures_path.field_0x18);
      generateChessTexture
                (local_2840,&local_24,&local_2844,local_b8,(string *)&textures_path.field_0x18);
      generateGradientTexture
                (local_2840,&local_24,&local_2844,local_b8,(string *)&textures_path.field_0x18);
      generatePerlinTexture
                (local_2840,&local_24,&local_2844,local_b8,(string *)&textures_path.field_0x18);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"perlin");
      if (bVar1) {
        generatePerlinTexture
                  (local_2840,&local_24,&local_2844,local_b8,(string *)&textures_path.field_0x18);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"gradient");
        if (bVar1) {
          generateGradientTexture
                    (local_2840,&local_24,&local_2844,local_b8,(string *)&textures_path.field_0x18);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"flat");
          if (bVar1) {
            generateFlatTexture(local_2840,&local_24,&local_2844,local_b8,
                                (string *)&textures_path.field_0x18);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"chess");
            if (!bVar1) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"No valid option selected! Exiting...")
              ;
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              exit(1);
            }
            generateChessTexture
                      (local_2840,&local_24,&local_2844,local_b8,(string *)&textures_path.field_0x18
                      );
          }
        }
      }
    }
    local_2844 = local_2844 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    // Command-line arguments
    unsigned int textures {0};
    unsigned int start {0};
    unsigned int resolution {0};
    std::string type;
    std::string media_dir;
    std::string output_dir;

    /* root directory */
    parseArgs(argc, argv, textures, start, media_dir, resolution, type);
    std::string textures_dir=media_dir+"textures/";
    std::string scripts_dir=media_dir+"scripts/";

    boost::filesystem::path textures_path(textures_dir);
    if (boost::filesystem::create_directories(textures_path)) {
        std::cout << "Created " << textures_dir << " folder"<< "\n";
    }

    boost::filesystem::path scripts_path(scripts_dir);
    if (boost::filesystem::create_directories(scripts_path)) {
        std::cout << "Created " << scripts_dir << " folder"<< "\n";
    }

    /* Initialize random device */
    std::random_device rd;
    std::mt19937 mt(rd());
    std::uniform_int_distribution<int> dist;

    /* Pattern generator object instance */
    PatternGeneration pattern_generation;

    for (unsigned int i = start; i < textures; ++i)
    {
        std::cout << "\rGenerating " << i + 1 << " of " << textures << std::flush;

        if (type=="all")
        {
            /* Generate flat texture */
            generateFlatTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate chess texture */
            generateChessTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate gradient texture */
            generateGradientTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate perlin noise texture */
            generatePerlinTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="perlin")
        {
            /* Generate perlin noise texture */
            generatePerlinTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="gradient")
        {
            /* Generate gradient texture */
            generateGradientTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="flat")
        {
            /* Generate flat texture */
            generateFlatTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="chess")
        {
            /* Generate chess texture */
            generateChessTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else
        {
            std::cerr << "No valid option selected! Exiting..." << std::endl;
            exit(EXIT_FAILURE);
        }
    }
    return 0;
}